

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O0

message_t * __thiscall
zmq::encode<std::vector<zmq::mutable_buffer,std::allocator<zmq::mutable_buffer>>,void>
          (message_t *__return_storage_ptr__,zmq *this,
          vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *parts)

{
  bool bVar1;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  int iVar5;
  range_error *this_00;
  reference pmVar6;
  size_t sVar7;
  void *__src;
  uchar *puVar8;
  uchar *part_data;
  uint32_t part_size_1;
  mutable_buffer *part_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *__range2_1;
  uchar *buf;
  size_t count_size;
  size_t part_size;
  mutable_buffer *part;
  const_iterator __end0;
  const_iterator __begin0;
  vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *__range2;
  size_t mmsg_size;
  vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *parts_local;
  message_t *encoded;
  
  __range2 = (vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *)0x0;
  __end0 = std::vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>::begin
                     ((vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *)this);
  part = (mutable_buffer *)
         std::vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>::end
                   ((vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_zmq::mutable_buffer_*,_std::vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>_>
                                     *)&part), bVar1) {
    pmVar6 = __gnu_cxx::
             __normal_iterator<const_zmq::mutable_buffer_*,_std::vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>_>
             ::operator*(&__end0);
    sVar7 = mutable_buffer::size(pmVar6);
    uVar4 = std::numeric_limits<unsigned_int>::max();
    if (uVar4 < sVar7) {
      this_00 = (range_error *)__cxa_allocate_exception(0x10);
      std::range_error::range_error(this_00,"Invalid size, message part too large");
      __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
    }
    bVar2 = std::numeric_limits<unsigned_char>::max();
    iVar5 = 5;
    if (sVar7 < bVar2) {
      iVar5 = 1;
    }
    __range2 = (vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *)
               ((long)&(__range2->
                       super__Vector_base<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>
                       )._M_impl.super__Vector_impl_data._M_start + sVar7 + (long)iVar5);
    __gnu_cxx::
    __normal_iterator<const_zmq::mutable_buffer_*,_std::vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>_>
    ::operator++(&__end0);
  }
  message_t::message_t(__return_storage_ptr__,(size_t)__range2);
  __range2_1 = (vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *)
               message_t::data<unsigned_char>(__return_storage_ptr__);
  __end0_1 = std::vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>::begin
                       ((vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *)this);
  part_1 = (mutable_buffer *)
           std::vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>::end
                     ((vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0_1,
                            (__normal_iterator<const_zmq::mutable_buffer_*,_std::vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>_>
                             *)&part_1), bVar1) {
    pmVar6 = __gnu_cxx::
             __normal_iterator<const_zmq::mutable_buffer_*,_std::vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>_>
             ::operator*(&__end0_1);
    sVar7 = mutable_buffer::size(pmVar6);
    __src = mutable_buffer::data(pmVar6);
    bVar2 = std::numeric_limits<unsigned_char>::max();
    if ((uint)sVar7 < (uint)bVar2) {
      *(char *)&(__range2_1->
                super__Vector_base<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>).
                _M_impl.super__Vector_impl_data._M_start = (char)sVar7;
      __range2_1 = (vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *)
                   ((long)&(__range2_1->
                           super__Vector_base<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    else {
      uVar3 = std::numeric_limits<unsigned_char>::max();
      *(uchar *)&(__range2_1->
                 super__Vector_base<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>).
                 _M_impl.super__Vector_impl_data._M_start = uVar3;
      detail::write_network_order
                ((uchar *)((long)&(__range2_1->
                                  super__Vector_base<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1),(uint)sVar7);
      __range2_1 = (vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *)
                   ((long)&(__range2_1->
                           super__Vector_base<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>
                           )._M_impl.super__Vector_impl_data._M_start + 5);
    }
    memcpy(__range2_1,__src,sVar7 & 0xffffffff);
    __range2_1 = (vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *)
                 ((long)&(__range2_1->
                         super__Vector_base<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>
                         )._M_impl.super__Vector_impl_data._M_start + (sVar7 & 0xffffffff));
    __gnu_cxx::
    __normal_iterator<const_zmq::mutable_buffer_*,_std::vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_>_>
    ::operator++(&__end0_1);
  }
  puVar8 = message_t::data<unsigned_char>(__return_storage_ptr__);
  if ((vector<zmq::mutable_buffer,_std::allocator<zmq::mutable_buffer>_> *)
      ((long)__range2_1 - (long)puVar8) != __range2) {
    __assert_fail("static_cast<size_t>(buf - encoded.data<unsigned char>()) == mmsg_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp",
                  0x13a,
                  "message_t zmq::encode(const Range &) [Range = std::vector<zmq::mutable_buffer>]")
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

message_t encode(const Range &parts)
{
    size_t mmsg_size = 0;

    // First pass check sizes
    for (const auto &part : parts) {
        const size_t part_size = part.size();
        if (part_size > (std::numeric_limits<std::uint32_t>::max)()) {
            // Size value must fit into uint32_t.
            throw std::range_error("Invalid size, message part too large");
        }
        const size_t count_size =
          part_size < (std::numeric_limits<std::uint8_t>::max)() ? 1 : 5;
        mmsg_size += part_size + count_size;
    }

    message_t encoded(mmsg_size);
    unsigned char *buf = encoded.data<unsigned char>();
    for (const auto &part : parts) {
        const uint32_t part_size = static_cast<uint32_t>(part.size());
        const unsigned char *part_data =
          static_cast<const unsigned char *>(part.data());

        if (part_size < (std::numeric_limits<std::uint8_t>::max)()) {
            // small part
            *buf++ = (unsigned char) part_size;
        } else {
            // big part
            *buf++ = (std::numeric_limits<uint8_t>::max)();
            detail::write_network_order(buf, part_size);
            buf += sizeof(part_size);
        }
        std::memcpy(buf, part_data, part_size);
        buf += part_size;
    }

    assert(static_cast<size_t>(buf - encoded.data<unsigned char>()) == mmsg_size);
    return encoded;
}